

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview.cpp
# Opt level: O3

void __thiscall QListView::doItemsLayout(QListView *this)

{
  QPersistentModelIndex *this_00;
  QListViewPrivate *this_01;
  QAbstractItemModel *pQVar1;
  bool bVar2;
  State state;
  int iVar3;
  long in_FS_OFFSET;
  QModelIndex local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = *(QListViewPrivate **)
             &(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.super_QWidget.
              field_0x8;
  state = QAbstractItemView::state((QAbstractItemView *)this);
  QAbstractItemView::setState((QAbstractItemView *)this,ExpandingState);
  pQVar1 = (this_01->super_QAbstractItemViewPrivate).model;
  this_00 = &(this_01->super_QAbstractItemViewPrivate).root;
  QPersistentModelIndex::operator_cast_to_QModelIndex(&local_50,this_00);
  iVar3 = (**(code **)(*(long *)pQVar1 + 0x80))(pQVar1,&local_50);
  if (iVar3 < 1) {
    (this_01->cachedItemSize).wd = -1;
    (this_01->cachedItemSize).ht = -1;
    (*this_01->commonListView->_vptr_QCommonListViewBase[5])();
  }
  else {
    this_01->commonListView->batchStartRow = 0;
    if (*(int *)(*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                           super_QWidget.field_0x8 + 0x564) == 0) {
      pQVar1 = (this_01->super_QAbstractItemViewPrivate).model;
      QPersistentModelIndex::operator_cast_to_QModelIndex(&local_50,this_00);
      iVar3 = (**(code **)(*(long *)pQVar1 + 0x78))(pQVar1,&local_50);
      QListViewPrivate::doItemsLayout(this_01,iVar3);
    }
    else if ((this_01->batchLayoutTimer).m_id == Invalid) {
      bVar2 = QListViewPrivate::doItemsLayout(this_01,this_01->batchSize);
      if (!bVar2) {
        QBasicTimer::start(&this_01->batchLayoutTimer,0,1,this);
      }
    }
  }
  QAbstractItemView::doItemsLayout((QAbstractItemView *)this);
  QAbstractItemView::setState((QAbstractItemView *)this,state);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QListView::doItemsLayout()
{
    Q_D(QListView);
    // showing the scroll bars will trigger a resize event,
    // so we set the state to expanding to avoid
    // triggering another layout
    QAbstractItemView::State oldState = state();
    setState(ExpandingState);
    if (d->model->columnCount(d->root) > 0) { // no columns means no contents
        d->resetBatchStartRow();
        if (layoutMode() == SinglePass) {
            d->doItemsLayout(d->model->rowCount(d->root)); // layout everything
        } else if (!d->batchLayoutTimer.isActive()) {
            if (!d->doItemsLayout(d->batchSize)) // layout is done
                d->batchLayoutTimer.start(0, this); // do a new batch as fast as possible
        }
    } else { // clear the QBspTree generated by the last layout
        d->clear();
    }
    QAbstractItemView::doItemsLayout();
    setState(oldState);        // restoring the oldState
}